

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network4.c
# Opt level: O0

int net_tcp4_nonblock_socket(void)

{
  int iVar1;
  int local_c;
  int s;
  
  local_c = socket(2,1,0);
  if (local_c == -1) {
    local_c = -1;
  }
  else {
    iVar1 = net_tcp4_socket_nonblock(local_c);
    if (iVar1 == -1) {
      close(local_c);
      local_c = -1;
    }
  }
  return local_c;
}

Assistant:

int net_tcp4_nonblock_socket(void) {
  int s;

  s = socket(AF_INET, SOCK_STREAM, 0);
  if (s == -1)
    return -1;
  if (net_tcp4_socket_nonblock(s) == -1) {
    close(s);
    return -1;
  }
  
  return s;
}